

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_string.c
# Opt level: O0

mk_list * mk_string_split_line(char *line)

{
  uint pos_end;
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  mk_string_line *new;
  mk_list *list;
  char *val;
  int end;
  uint val_len;
  uint len;
  uint i;
  char *line_local;
  
  val_len = 0;
  if (line == (char *)0x0) {
    line_local = (char *)0x0;
  }
  else {
    line_local = (char *)mk_mem_alloc(0x10);
    if ((mk_list *)line_local == (mk_list *)0x0) {
      line_local = (char *)0x0;
    }
    else {
      mk_list_init((mk_list *)line_local);
      sVar2 = strlen(line);
      pos_end = (uint)sVar2;
      while (val_len < pos_end) {
        iVar1 = mk_string_char_search(line + val_len,0x20,pos_end - val_len);
        if ((iVar1 < 0) || (pos_end <= iVar1 + val_len)) {
          list = (mk_list *)mk_string_copy_substr(line,val_len,pos_end);
          val._4_4_ = pos_end - val_len;
          val._0_4_ = pos_end;
LAB_0011ca84:
          puVar3 = (undefined8 *)mk_mem_alloc(0x20);
          *puVar3 = list;
          *(int *)(puVar3 + 1) = val._4_4_;
          mk_list_add((mk_list *)(puVar3 + 2),(mk_list *)line_local);
          val_len = (uint)val + 1;
        }
        else {
          val._0_4_ = val_len + iVar1;
          if (val_len != (uint)val) {
            list = (mk_list *)mk_string_copy_substr(line,val_len,(uint)val);
            val._4_4_ = (uint)val - val_len;
            goto LAB_0011ca84;
          }
          val_len = val_len + 1;
        }
      }
    }
  }
  return (mk_list *)line_local;
}

Assistant:

struct mk_list *mk_string_split_line(const char *line)
{
    unsigned int i = 0, len, val_len;
    int end;
    char *val;
    struct mk_list *list;
    struct mk_string_line *new;

    if (!line) {
        return NULL;
    }

    list = mk_mem_alloc(sizeof(struct mk_list));
    if (!list) {
        return NULL;
    }
    mk_list_init(list);

    len = strlen(line);

    while (i < len) {
        end = mk_string_char_search(line + i, ' ', len - i);

        if (end >= 0 && end + i < len) {
            end += i;

            if (i == (unsigned int) end) {
                i++;
                continue;
            }

            val = mk_string_copy_substr(line, i, end);
            val_len = end - i;
        }
        else {
            val = mk_string_copy_substr(line, i, len);
            val_len = len - i;
            end = len;

        }

        /* Alloc node */
        new = mk_mem_alloc(sizeof(struct mk_string_line));
        new->val = val;
        new->len = val_len;

        mk_list_add(&new->_head, list);
        i = end + 1;
    }

    return list;
}